

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void __thiscall Imf_2_5::Header::setType(Header *this,string *type)

{
  bool bVar1;
  TypedAttribute<int> *pTVar2;
  ArgExc *this_00;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = isSupportedType(type);
  if (bVar1) {
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::TypedAttribute(&local_158,type);
    insert(this,"type",&local_158.super_Attribute);
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~TypedAttribute(&local_158);
    bVar1 = isDeepData(type);
    if (bVar1) {
      pTVar2 = findTypedAttribute<Imf_2_5::TypedAttribute<int>>(this,"version");
      if (pTVar2 == (TypedAttribute<int> *)0x0) {
        setVersion(this,1);
      }
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  std::operator+(&local_d0,type,"is not a supported image type.");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_130._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar4) {
    local_130.field_2._M_allocated_capacity = *psVar4;
    local_130.field_2._8_8_ = plVar3[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar4;
  }
  local_130._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_b0,&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_110._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
    local_110.field_2._M_allocated_capacity = *psVar4;
    local_110.field_2._8_8_ = plVar3[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar4;
  }
  local_110._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_90,&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Imf_2_5::TILEDIMAGE_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar4) {
    local_f0.field_2._M_allocated_capacity = *psVar4;
    local_f0.field_2._8_8_ = plVar3[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar4;
  }
  local_f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_70,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Imf_2_5::DEEPSCANLINE_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_178._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_178._M_dataplus._M_p == psVar4) {
    local_178.field_2._M_allocated_capacity = *psVar4;
    local_178.field_2._8_8_ = plVar3[3];
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    local_178.field_2._M_allocated_capacity = *psVar4;
  }
  local_178._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_50,&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Imf_2_5::DEEPTILE_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_158.super_Attribute._vptr_Attribute = (_func_int **)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if (local_158.super_Attribute._vptr_Attribute == (_func_int **)psVar4) {
    local_158._value._M_string_length = *psVar4;
    local_158._value.field_2._M_allocated_capacity = plVar3[3];
    local_158.super_Attribute._vptr_Attribute = (_func_int **)&local_158._value._M_string_length;
  }
  else {
    local_158._value._M_string_length = *psVar4;
  }
  local_158._value._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Iex_2_5::ArgExc::ArgExc(this_00,(string *)&local_158);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
Header::setType(const string& type)
{
    if (isSupportedType(type) == false)
    {
        throw IEX_NAMESPACE::ArgExc (type + "is not a supported image type." +
                           "The following are supported: " +
                           SCANLINEIMAGE + ", " +
                           TILEDIMAGE + ", " +
                           DEEPSCANLINE + " or " +
                           DEEPTILE + ".");
    }

    insert ("type", StringAttribute (type));

    // (TODO) Should we do it here?
    if (isDeepData(type) && hasVersion() == false)
    {
        setVersion(1);
    }
}